

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::cpp_regex_traits_base<char,_1UL>::imbue
          (cpp_regex_traits_base<char,_1UL> *this,locale *loc)

{
  locale *in_RSI;
  long in_RDI;
  mask tmp [256];
  ctype<char> *ct;
  char allchars [256];
  int i;
  mask local_328 [260];
  ctype *local_120;
  char local_118 [256];
  char acStack_18 [4];
  int local_14;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    local_118[local_14] = (char)local_14;
  }
  local_120 = std::use_facet<std::ctype<char>>(in_RSI);
  std::ctype<char>::is((ctype<char> *)local_120,local_118,acStack_18,local_328);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    *(mask *)(in_RDI + (long)local_14 * 2) = local_328[local_14];
  }
  *(ushort *)(in_RDI + 0xbe) = *(ushort *)(in_RDI + 0xbe) | 0x80;
  *(ushort *)(in_RDI + 0x40) = *(ushort *)(in_RDI + 0x40) | 0x40;
  *(ushort *)(in_RDI + 0x12) = *(ushort *)(in_RDI + 0x12) | 0x40;
  *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x20;
  *(ushort *)(in_RDI + 0x1a) = *(ushort *)(in_RDI + 0x1a) | 0x20;
  *(ushort *)(in_RDI + 0x18) = *(ushort *)(in_RDI + 0x18) | 0x20;
  return;
}

Assistant:

void imbue(std::locale const &loc)
        {
            int i = 0;
            Char allchars[UCHAR_MAX + 1];
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                allchars[i] = static_cast<Char>(i);
            }

            std::ctype<Char> const &ct = BOOST_USE_FACET(std::ctype<Char>, loc);
            std::ctype_base::mask tmp[UCHAR_MAX + 1];
            ct.is(allchars, allchars + UCHAR_MAX + 1, tmp);
            for(i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                this->masks_[i] = static_cast<umask_t>(tmp[i]);
                BOOST_ASSERT(0 == (this->masks_[i] & non_std_ctype_masks));
            }

            this->masks_[static_cast<unsigned char>('_')] |= non_std_ctype_underscore;
            this->masks_[static_cast<unsigned char>(' ')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\t')] |= non_std_ctype_blank;
            this->masks_[static_cast<unsigned char>('\n')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\r')] |= non_std_ctype_newline;
            this->masks_[static_cast<unsigned char>('\f')] |= non_std_ctype_newline;
        }